

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine.cpp
# Opt level: O0

void __thiscall QPaintEngine::drawLines(QPaintEngine *this,QLine *lines,int lineCount)

{
  int iVar1;
  int extraout_EAX;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int i;
  LineF fl [256];
  int local_2020;
  int local_201c;
  long local_2018;
  double local_2008 [1024];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_2008,0xff,0x2000);
  local_2018 = in_RSI;
  for (local_201c = in_EDX; local_201c != 0; local_201c = local_201c - local_2020) {
    for (local_2020 = 0; local_2020 < local_201c && local_2020 < 0x100; local_2020 = local_2020 + 1)
    {
      iVar1 = QLine::x1((QLine *)0x558a3d);
      local_2008[(long)local_2020 * 4] = (double)iVar1;
      QLine::y1((QLine *)(local_2018 + (long)local_2020 * 0x10),(double)iVar1);
      local_2008[(long)local_2020 * 4 + 1] = (double)extraout_EAX;
      iVar1 = QLine::x2((QLine *)0x558a9c);
      local_2008[(long)local_2020 * 4 + 2] = (double)iVar1;
      iVar1 = QLine::y2((QLine *)0x558acc);
      local_2008[(long)local_2020 * 4 + 3] = (double)iVar1;
    }
    (**(code **)(*in_RDI + 0x40))(in_RDI,local_2008,local_2020);
    local_2018 = local_2018 + (long)local_2020 * 0x10;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPaintEngine::drawLines(const QLine *lines, int lineCount)
{
    struct PointF {
        qreal x;
        qreal y;
    };
    struct LineF {
        PointF p1;
        PointF p2;
    };
    Q_ASSERT(sizeof(PointF) == sizeof(QPointF));
    Q_ASSERT(sizeof(LineF) == sizeof(QLineF));
    LineF fl[256];
    while (lineCount) {
        int i = 0;
        while (i < lineCount && i < 256) {
            fl[i].p1.x = lines[i].x1();
            fl[i].p1.y = lines[i].y1();
            fl[i].p2.x = lines[i].x2();
            fl[i].p2.y = lines[i].y2();
            ++i;
        }
        drawLines((QLineF *)(void *)fl, i);
        lines += i;
        lineCount -= i;
    }
}